

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O3

BIGNUM * bn_expand2(BIGNUM *a,int words)

{
  uint uVar1;
  ulong *pnt;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  ulong *puVar6;
  ulong *puVar7;
  int iVar8;
  uint uVar9;
  
  if (a->dmax < words) {
    if ((words < 0x800000) && ((a->flags & 2U) == 0)) {
      if ((a->flags & 8U) == 0) {
        puVar5 = (ulong *)CRYPTO_zalloc((long)words << 3);
      }
      else {
        puVar5 = (ulong *)CRYPTO_secure_zalloc((long)words << 3);
      }
      if (puVar5 != (ulong *)0x0) {
        pnt = a->d;
        if (pnt != (ulong *)0x0) {
          uVar1 = a->top;
          iVar8 = (int)uVar1 >> 2;
          puVar6 = puVar5;
          puVar7 = pnt;
          if (0 < iVar8) {
            uVar9 = iVar8 + 1;
            do {
              uVar2 = puVar7[1];
              uVar3 = puVar7[2];
              uVar4 = puVar7[3];
              *puVar6 = *puVar7;
              puVar6[1] = uVar2;
              puVar6[2] = uVar3;
              puVar6[3] = uVar4;
              puVar6 = puVar6 + 4;
              puVar7 = puVar7 + 4;
              uVar9 = uVar9 - 1;
            } while (1 < uVar9);
          }
          switch(uVar1 & 3) {
          case 3:
            puVar6[2] = puVar7[2];
          case 2:
            puVar6[1] = puVar7[1];
          case 1:
            *puVar6 = *puVar7;
          case 0:
            CRYPTO_memzero(pnt,(long)a->dmax << 3);
            bn_free_d((BIGNUM *)a);
          }
        }
        a->d = puVar5;
        a->dmax = words;
        return a;
      }
    }
    a = (BIGNUM *)0x0;
  }
  return a;
}

Assistant:

BIGNUM *bn_expand2(BIGNUM *b, int words)
{
    bn_check_top(b);

    if (words > b->dmax) {
        BN_ULONG *a = bn_expand_internal(b, words);
        if (!a)
            return NULL;
        if (b->d) {
            CRYPTO_memzero(b->d, b->dmax * sizeof(b->d[0]));
            bn_free_d(b);
        }
        b->d = a;
        b->dmax = words;
    }

    bn_check_top(b);
    return b;
}